

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedStepIntegrator.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::FixedStepIntegrator::integrate
          (FixedStepIntegrator *this,double initialTime,double finalTime)

{
  vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  *this_00;
  DynamicalSystem *this_01;
  int iVar1;
  string *psVar2;
  size_t sVar3;
  ulong uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  pointer pSVar8;
  pointer pcVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  ostringstream errorMsg;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  this_01 = (this->super_Integrator).m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_01 == (DynamicalSystem *)0x0) {
    psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
    pcVar9 = (psVar2->_M_dataplus)._M_p;
    pcVar6 = "No dynamical system have been set yet.";
  }
  else {
    dVar14 = finalTime - initialTime;
    if (dVar14 < 0.0) {
      psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar2->_M_dataplus)._M_p;
      pcVar6 = "The final time is supposed to be greater than the initial time.";
    }
    else if ((this->super_Integrator).m_dTmax <= 0.0) {
      psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar2->_M_dataplus)._M_p;
      pcVar6 = "The maximum dT should be greater than zero.";
    }
    else {
      sVar3 = DynamicalSystem::stateSpaceSize(this_01);
      dVar13 = ceil(dVar14 / (this->super_Integrator).m_dTmax);
      iVar10 = (int)dVar13;
      this_00 = &(this->super_Integrator).m_solution;
      std::
      vector<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
      ::resize(this_00,(long)(iVar10 + 1));
      (*((this->super_Integrator).m_dynamicalSystem_ptr.
         super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_DynamicalSystem[6])();
      uVar4 = iDynTree::VectorDynSize::size();
      if (uVar4 == (sVar3 & 0xffffffff)) {
        iDynTree::VectorDynSize::resize
                  ((ulong)(this->super_Integrator).m_solution.
                          super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        iVar1 = (*((this->super_Integrator).m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_DynamicalSystem[6])();
        iDynTree::VectorDynSize::operator=
                  (&((this->super_Integrator).m_solution.
                     super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                     ._M_impl.super__Vector_impl_data._M_start)->stateAtT,
                   (VectorDynSize *)CONCAT44(extraout_var,iVar1));
        pSVar8 = (this->super_Integrator).m_solution.
                 super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar8->time = initialTime;
        if (iVar10 < 1) {
          dVar14 = 0.0;
        }
        else {
          dVar14 = dVar14 / (double)iVar10;
        }
        uVar11 = iVar10 - 1;
        lVar12 = 0;
        uVar4 = 0;
        if (0 < (int)uVar11) {
          uVar4 = (ulong)uVar11;
        }
        uVar7 = 0;
        do {
          if (uVar4 == uVar7) {
            iVar10 = (*(this->super_Integrator)._vptr_Integrator[0x10])
                               (pSVar8[(int)uVar11].time,finalTime - pSVar8[(int)uVar11].time,this,
                                pSVar8 + (int)uVar11,
                                (this->super_Integrator).m_solution.
                                super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
            if ((char)iVar10 != '\0') {
              (this->super_Integrator).m_solution.
              super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].time = finalTime;
              return true;
            }
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,"Error in last iteration");
            psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
            pcVar6 = (psVar2->_M_dataplus)._M_p;
            std::__cxx11::stringbuf::str();
            iDynTree::reportError(pcVar6,"integrate",local_1c8[0]);
LAB_001a4fb2:
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            return false;
          }
          iVar10 = (*(this->super_Integrator)._vptr_Integrator[0x10])
                             (this,&pSVar8->stateAtT + lVar12,&pSVar8[1].stateAtT + lVar12);
          if ((char)iVar10 == '\0') {
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,"Error at time ");
            poVar5 = std::ostream::_M_insert<double>((double)(int)uVar7 * dVar14 + initialTime);
            std::operator<<(poVar5,".");
            psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
            pcVar6 = (psVar2->_M_dataplus)._M_p;
            std::__cxx11::stringbuf::str();
            iDynTree::reportError(pcVar6,"integrate",local_1c8[0]);
            goto LAB_001a4fb2;
          }
          uVar7 = uVar7 + 1;
          pSVar8 = (this_00->
                   super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(double *)((long)&pSVar8[1].time + lVar12) = (double)(int)uVar7 * dVar14 + initialTime;
          lVar12 = lVar12 + 0x28;
        } while( true );
      }
      psVar2 = IntegratorInfo::name_abi_cxx11_(&(this->super_Integrator).m_info);
      pcVar9 = (psVar2->_M_dataplus)._M_p;
      pcVar6 = "The initial state has a wrong dimension.";
    }
  }
  iDynTree::reportError(pcVar9,"integrate",pcVar6);
  return false;
}

Assistant:

bool FixedStepIntegrator::integrate(double initialTime, double finalTime){

                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "integrate", "No dynamical system have been set yet.");
                    return false;
                }

                if ((finalTime - initialTime) < 0){
                    reportError(m_info.name().c_str(), "integrate", "The final time is supposed to be greater than the initial time.");
                    return false;
                }
                if (m_dTmax <= 0){
                    reportError(m_info.name().c_str(), "integrate", "The maximum dT should be greater than zero.");
                    return false;
                }

                unsigned int stateDim = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());

                int iterations = std::ceil((finalTime - initialTime)/m_dTmax);

                m_solution.resize(iterations+1);

                if(m_dynamicalSystem_ptr->initialState().size() != stateDim){
                    reportError(m_info.name().c_str(), "integrate", "The initial state has a wrong dimension.");
                    return false;
                }

                m_solution[0].stateAtT.resize(stateDim);
                m_solution[0].stateAtT = m_dynamicalSystem_ptr->initialState();
                m_solution[0].time = initialTime;

                double dT = 0;
                if (iterations > 0){
                    dT = (finalTime - initialTime)/iterations;
                }

                for(int i = 0; i < (iterations - 1); ++i){
                    if (!oneStepIntegration(initialTime + dT*i, dT, m_solution[i].stateAtT, m_solution[i+1].stateAtT)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error at time " << initialTime + dT*i << ".";
                        reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                        return false;
                    }
                    m_solution[i+1].time = initialTime + dT*(i+1);
                }
                //Consider last step separately to be sure that the last solution point is in finalTime
                dT = finalTime - m_solution[iterations - 1].time;
                if (!oneStepIntegration(m_solution[iterations - 1].time, dT, m_solution[iterations - 1].stateAtT, m_solution.back().stateAtT)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error in last iteration";
                    reportError(m_info.name().c_str(), "integrate", errorMsg.str().c_str());
                    return false;
                }
                m_solution.back().time = finalTime;

                return true;
            }